

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# armformatter.cpp
# Opt level: O0

Error asmjit::v1_14::arm::FormatterInternal::formatRegister
                (String *sb,FormatFlags flags,BaseEmitter *emitter,Arch arch,RegType regType,
                uint32_t rId,uint32_t elementType,uint32_t elementIndex)

{
  bool bVar1;
  Error EVar2;
  VirtReg *pVVar3;
  byte in_CL;
  long in_RDX;
  String *in_RDI;
  byte in_R8B;
  uint in_R9D;
  uint in_stack_00000008;
  uint in_stack_00000010;
  Error _err_7;
  Error _err_6;
  Error _err_5;
  Error _err_4;
  uint32_t elementCount;
  FormatElementData elementData;
  uint32_t kElementTypeCount;
  Error _err_3;
  Error _err_2;
  char letter;
  Error _err_1;
  Error _err;
  char *name;
  VirtReg *vReg;
  BaseCompiler *cc;
  bool virtRegFormatted;
  char *in_stack_000001c0;
  int in_stack_000001cc;
  char *in_stack_000001d0;
  uint32_t in_stack_fffffffffffffdcc;
  undefined4 in_stack_fffffffffffffdd0;
  char c;
  ModifyOp in_stack_fffffffffffffdd4;
  VirtReg *in_stack_fffffffffffffdd8;
  VirtReg *in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdec;
  ModifyOp in_stack_fffffffffffffdf4;
  undefined4 in_stack_fffffffffffffdf8;
  uint uVar4;
  undefined1 in_stack_fffffffffffffdfc;
  undefined1 in_stack_fffffffffffffdfd;
  byte bVar5;
  undefined2 in_stack_fffffffffffffdfe;
  char local_1ed;
  Error local_19c;
  undefined8 in_stack_fffffffffffffeb0;
  StringFormatFlags flags_00;
  size_t in_stack_fffffffffffffeb8;
  undefined8 in_stack_fffffffffffffec0;
  uint32_t base;
  uint64_t in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffed0;
  ModifyOp op;
  String *in_stack_fffffffffffffed8;
  
  op = (ModifyOp)((ulong)in_stack_fffffffffffffed0 >> 0x20);
  base = (uint32_t)((ulong)in_stack_fffffffffffffec0 >> 0x20);
  flags_00 = (StringFormatFlags)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
  bVar1 = false;
  if ((((in_R9D - 0x100 < 0xfffffeff) && (in_RDX != 0)) && (*(char *)(in_RDX + 8) == '\x03')) &&
     (in_R9D - 0x100 < *(uint *)(in_RDX + 0x1f0))) {
    pVVar3 = BaseCompiler::virtRegById
                       ((BaseCompiler *)
                        CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                        in_stack_fffffffffffffdcc);
    if (pVVar3 == (VirtReg *)0x0) {
      DebugUtils::assertionFailed(in_stack_000001d0,in_stack_000001cc,in_stack_000001c0);
    }
    in_stack_fffffffffffffde0 = pVVar3 + 0x18;
    if (*(uint *)in_stack_fffffffffffffde0 < 0xc) {
      in_stack_fffffffffffffdd8 = pVVar3 + 0x1c;
    }
    else {
      in_stack_fffffffffffffdd8 = *(VirtReg **)(pVVar3 + 0x20);
    }
    if ((in_stack_fffffffffffffdd8 == (VirtReg *)0x0) ||
       (*in_stack_fffffffffffffdd8 == (VirtReg)0x0)) {
      EVar2 = String::_opFormat(in_RDI,kAppend,"%%%u",(ulong)(in_R9D - 0x100));
    }
    else {
      in_stack_fffffffffffffec8 = 0xffffffffffffffff;
      pVVar3 = in_stack_fffffffffffffdd8;
      in_stack_fffffffffffffed8 = in_RDI;
      EVar2 = String::_opString((String *)
                                CONCAT26(in_stack_fffffffffffffdfe,
                                         CONCAT15(in_stack_fffffffffffffdfd,
                                                  CONCAT14(in_stack_fffffffffffffdfc,
                                                           in_stack_fffffffffffffdf8))),
                                in_stack_fffffffffffffdf4,
                                (char *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8
                                                ),(size_t)in_stack_fffffffffffffde0);
      op = (ModifyOp)((ulong)pVVar3 >> 0x20);
    }
    if (EVar2 != 0) {
      return EVar2;
    }
    bVar1 = true;
  }
  if (bVar1) goto LAB_0016e0e9;
  local_1ed = '\0';
  in_stack_fffffffffffffdd4 = CONCAT13(in_R8B,(int3)in_stack_fffffffffffffdd4);
  if (in_R8B == 6) {
    if ((in_CL & 1) == 0) {
      local_1ed = 'w';
      if (in_R9D == 0x3f) {
        EVar2 = String::_opString((String *)
                                  CONCAT26(in_stack_fffffffffffffdfe,
                                           CONCAT15(in_stack_fffffffffffffdfd,
                                                    CONCAT14(in_stack_fffffffffffffdfc,
                                                             in_stack_fffffffffffffdf8))),
                                  in_stack_fffffffffffffdf4,
                                  (char *)CONCAT44(in_stack_fffffffffffffdec,
                                                   in_stack_fffffffffffffde8),
                                  (size_t)in_stack_fffffffffffffde0);
        return EVar2;
      }
      if (in_R9D == 0x1f) {
        EVar2 = String::_opString((String *)
                                  CONCAT26(in_stack_fffffffffffffdfe,
                                           CONCAT15(in_stack_fffffffffffffdfd,
                                                    CONCAT14(in_stack_fffffffffffffdfc,
                                                             in_stack_fffffffffffffdf8))),
                                  in_stack_fffffffffffffdf4,
                                  (char *)CONCAT44(in_stack_fffffffffffffdec,
                                                   in_stack_fffffffffffffde8),
                                  (size_t)in_stack_fffffffffffffde0);
        return EVar2;
      }
    }
    else {
      local_1ed = 'r';
    }
  }
  else if (in_R8B == 7) {
    if ((in_CL & 1) != 0) goto LAB_0016dfa4;
    if (in_R9D == 0x3f) {
      EVar2 = String::_opString((String *)
                                CONCAT26(in_stack_fffffffffffffdfe,
                                         CONCAT15(in_stack_fffffffffffffdfd,
                                                  CONCAT14(in_stack_fffffffffffffdfc,
                                                           in_stack_fffffffffffffdf8))),
                                in_stack_fffffffffffffdf4,
                                (char *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8
                                                ),(size_t)in_stack_fffffffffffffde0);
      return EVar2;
    }
    if (in_R9D == 0x1f) {
      EVar2 = String::_opString((String *)
                                CONCAT26(in_stack_fffffffffffffdfe,
                                         CONCAT15(in_stack_fffffffffffffdfd,
                                                  CONCAT14(in_stack_fffffffffffffdfc,
                                                           in_stack_fffffffffffffdf8))),
                                in_stack_fffffffffffffdf4,
                                (char *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8
                                                ),(size_t)in_stack_fffffffffffffde0);
      return EVar2;
    }
    local_1ed = 'x';
  }
  else if ((byte)(in_R8B - 8) < 5) {
    local_1ed = "bhsdq"[in_R8B - 8];
    if (in_stack_00000008 != 0) {
      local_1ed = 'v';
    }
  }
  else {
LAB_0016dfa4:
    EVar2 = String::_opFormat(in_RDI,kAppend,"<Reg-%u>?%u",(ulong)in_R8B,(ulong)in_R9D);
    if (EVar2 != 0) {
      return EVar2;
    }
  }
  if ((local_1ed != '\0') &&
     (EVar2 = String::_opFormat(in_RDI,kAppend,"%c%u",(ulong)(uint)(int)local_1ed,(ulong)in_R9D),
     EVar2 != 0)) {
    return EVar2;
  }
LAB_0016e0e9:
  if (in_stack_00000008 != 0) {
    if (7 < in_stack_00000008) {
      in_stack_00000008 = 7;
    }
    bVar5 = (byte)((uint)*(undefined4 *)(formatElementDataTable + (ulong)in_stack_00000008 * 4) >> 8
                  );
    if (in_R8B == 0xb) {
      bVar5 = bVar5 >> 1;
    }
    uVar4 = (uint)bVar5;
    EVar2 = String::_opChar((String *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd4,
                            (char)(in_stack_00000008 >> 0x18));
    c = (char)(in_stack_00000008 >> 0x18);
    if (EVar2 != 0) {
      return EVar2;
    }
    if ((uVar4 != 0) &&
       (EVar2 = String::_opNumber(in_stack_fffffffffffffed8,op,in_stack_fffffffffffffec8,base,
                                  in_stack_fffffffffffffeb8,flags_00), EVar2 != 0)) {
      return EVar2;
    }
    EVar2 = String::_opChar((String *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd4,c);
    if (EVar2 != 0) {
      return EVar2;
    }
  }
  if ((in_stack_00000010 == 0xffffffff) ||
     (local_19c = String::_opFormat(in_RDI,kAppend,"[%u]",(ulong)in_stack_00000010), local_19c == 0)
     ) {
    local_19c = 0;
  }
  return local_19c;
}

Assistant:

ASMJIT_FAVOR_SIZE Error FormatterInternal::formatRegister(
  String& sb,
  FormatFlags flags,
  const BaseEmitter* emitter,
  Arch arch,
  RegType regType,
  uint32_t rId,
  uint32_t elementType,
  uint32_t elementIndex) noexcept {

  DebugUtils::unused(flags);
  DebugUtils::unused(arch);

  static const char bhsdq[] = "bhsdq";

  bool virtRegFormatted = false;

#ifndef ASMJIT_NO_COMPILER
  if (Operand::isVirtId(rId)) {
    if (emitter && emitter->isCompiler()) {
      const BaseCompiler* cc = static_cast<const BaseCompiler*>(emitter);
      if (cc->isVirtIdValid(rId)) {
        VirtReg* vReg = cc->virtRegById(rId);
        ASMJIT_ASSERT(vReg != nullptr);

        const char* name = vReg->name();
        if (name && name[0] != '\0')
          ASMJIT_PROPAGATE(sb.append(name));
        else
          ASMJIT_PROPAGATE(sb.appendFormat("%%%u", unsigned(Operand::virtIdToIndex(rId))));

        virtRegFormatted = true;
      }
    }
  }
#else
  DebugUtils::unused(emitter, flags);
#endif

  if (!virtRegFormatted) {
    char letter = '\0';
    switch (regType) {
      case RegType::kARM_VecB:
      case RegType::kARM_VecH:
      case RegType::kARM_VecS:
      case RegType::kARM_VecD:
      case RegType::kARM_VecV:
        letter = bhsdq[uint32_t(regType) - uint32_t(RegType::kARM_VecB)];
        if (elementType)
          letter = 'v';
        break;

      case RegType::kARM_GpW:
        if (Environment::is64Bit(arch)) {
          letter = 'w';

          if (rId == a64::Gp::kIdZr)
            return sb.append("wzr", 3);

          if (rId == a64::Gp::kIdSp)
            return sb.append("wsp", 3);
        }
        else {
          letter = 'r';
        }
        break;

      case RegType::kARM_GpX:
        if (Environment::is64Bit(arch)) {
          if (rId == a64::Gp::kIdZr)
            return sb.append("xzr", 3);
          if (rId == a64::Gp::kIdSp)
            return sb.append("sp", 2);

          letter = 'x';
          break;
        }

        // X registers are undefined in 32-bit mode.
        ASMJIT_FALLTHROUGH;

      default:
        ASMJIT_PROPAGATE(sb.appendFormat("<Reg-%u>?%u", uint32_t(regType), rId));
        break;
    }

    if (letter)
      ASMJIT_PROPAGATE(sb.appendFormat("%c%u", letter, rId));
  }

  constexpr uint32_t kElementTypeCount = uint32_t(a64::VecElementType::kMaxValue) + 1;
  if (elementType) {
    elementType = Support::min(elementType, kElementTypeCount);

    FormatElementData elementData = formatElementDataTable[elementType];
    uint32_t elementCount = elementData.elementCount;

    if (regType == RegType::kARM_VecD) {
      elementCount /= 2u;
    }

    ASMJIT_PROPAGATE(sb.append('.'));
    if (elementCount) {
      ASMJIT_PROPAGATE(sb.appendUInt(elementCount));
    }
    ASMJIT_PROPAGATE(sb.append(elementData.letter));
  }

  if (elementIndex != 0xFFFFFFFFu) {
    ASMJIT_PROPAGATE(sb.appendFormat("[%u]", elementIndex));
  }

  return kErrorOk;
}